

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

void __thiscall ON_3dmAnnotationContext::Internal_Destroy(ON_3dmAnnotationContext *this)

{
  SetReferencedAnnotationSettings(this,(ON_3dmAnnotationSettings *)0x0);
  if (this->m_managed_parent_dim_style != (ON_DimStyle *)0x0) {
    (*(this->m_managed_parent_dim_style->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4]
    )();
    this->m_managed_parent_dim_style = (ON_DimStyle *)0x0;
  }
  if (this->m_managed_override_dim_style != (ON_DimStyle *)0x0) {
    (*(this->m_managed_override_dim_style->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object
      [4])();
    this->m_managed_override_dim_style = (ON_DimStyle *)0x0;
  }
  this->m_parent_dim_style = (ON_DimStyle *)0x0;
  this->m_override_dim_style = (ON_DimStyle *)0x0;
  this->m_V5_3dm_archive_dim_style_index = -0x7fffffff;
  this->m_view_context = Default.m_view_context;
  this->m_model_length_unit_system = Default.m_model_length_unit_system;
  this->m_page_length_unit_system = Default.m_page_length_unit_system;
  this->m_binary_archive = Default.m_binary_archive;
  return;
}

Assistant:

void ON_3dmAnnotationContext::Internal_Destroy()
{
  SetReferencedAnnotationSettings(nullptr);
  SetReferencedDimStyle(nullptr,nullptr,ON_UNSET_INT_INDEX);
  m_view_context = ON_3dmAnnotationContext::Default.m_view_context;
  m_model_length_unit_system = ON_3dmAnnotationContext::Default.m_model_length_unit_system;
  m_page_length_unit_system = ON_3dmAnnotationContext::Default.m_page_length_unit_system;
  m_binary_archive = ON_3dmAnnotationContext::Default.m_binary_archive;
}